

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_set.hpp
# Opt level: O2

void __thiscall
duckdb::LogicalSet::LogicalSet(LogicalSet *this,string *name_p,Value *value_p,SetScope scope_p)

{
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_SET);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalSet_027c1508;
  ::std::__cxx11::string::string((string *)&this->name,(string *)name_p);
  Value::Value(&this->value,value_p);
  this->scope = scope_p;
  return;
}

Assistant:

LogicalSet(std::string name_p, Value value_p, SetScope scope_p)
	    : LogicalOperator(LogicalOperatorType::LOGICAL_SET), name(std::move(name_p)), value(std::move(value_p)),
	      scope(scope_p) {
	}